

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O1

void comex_make_progress(void)

{
  char **ppcVar1;
  uint uVar2;
  lock_link *plVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  message_t *__ptr;
  int iVar7;
  uint *__ptr_00;
  barrier_t *pbVar8;
  void *pvVar9;
  comex_lock_t *pcVar10;
  char *pcVar11;
  get_t *pgVar12;
  long lVar13;
  int count;
  get_t *need_to_free;
  get_t *__ptr_01;
  get_link *pgVar14;
  uint *__src;
  comex_lock_t *__ptr_02;
  comex_lock_t *pcVar15;
  size_t __n;
  bool bVar16;
  bool bVar17;
  int iprobe_flag;
  int flag;
  MPI_Status iprobe_status;
  MPI_Status recv_status;
  int local_78;
  int local_74;
  long *local_70;
  void *local_68;
  int local_60 [6];
  undefined1 local_48 [24];
  
  do {
    local_78 = 0;
    while (l_state.mq_head != (message_t *)0x0) {
      if (l_state.mq_head == (message_t *)0x0) {
        __assert_fail("l_state.mq_head",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                      ,0xd2,"int _mq_test()");
      }
      if (l_state.mq_tail == (message_t *)0x0) {
        __assert_fail("l_state.mq_tail",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                      ,0xd3,"int _mq_test()");
      }
      if ((l_state.mq_head)->request == (MPI_Request)&ompi_request_null) {
        __assert_fail("l_state.mq_head->request != MPI_REQUEST_NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                      ,0xd4,"int _mq_test()");
      }
      iVar7 = MPI_Test(&(l_state.mq_head)->request,&local_74,local_48);
      __ptr = l_state.mq_head;
      if (iVar7 != 0) {
        __assert_fail("MPI_SUCCESS == rc",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                      ,0xd7,"int _mq_test()");
      }
      if (local_74 == 0) break;
      if (l_state.mq_head == (message_t *)0x0) {
        __assert_fail("l_state.mq_head",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                      ,0xe1,"void _mq_pop()");
      }
      if (l_state.mq_tail == (message_t *)0x0) {
        __assert_fail("l_state.mq_tail",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                      ,0xe2,"void _mq_pop()");
      }
      if ((l_state.mq_head)->request != (MPI_Request)&ompi_request_null) {
        __assert_fail("l_state.mq_head->request == MPI_REQUEST_NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                      ,0xe3,"void _mq_pop()");
      }
      ppcVar1 = &(l_state.mq_head)->message;
      l_state.mq_head = (l_state.mq_head)->next;
      free(*ppcVar1);
      free(__ptr);
      if (l_state.mq_head == (message_t *)0x0) {
        l_state.mq_tail = (message_t *)0x0;
      }
      iVar7 = l_state.mq_size + -1;
      bVar16 = l_state.mq_size < 1;
      l_state.mq_size = iVar7;
      if (bVar16) {
        __assert_fail("l_state.mq_size >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                      ,0xf1,"void _mq_pop()");
      }
    }
    __ptr_01 = l_state.gq_head;
    l_state.gq_head = (get_t *)0x0;
    l_state.gq_tail = (get_t *)0x0;
    while (__ptr_01 != (get_t *)0x0) {
      if (*__ptr_01->notify_address == '\0') {
        pgVar14 = __ptr_01->next;
        free(__ptr_01->notify_address);
        free(__ptr_01);
      }
      else {
        pgVar12 = (get_t *)&l_state.gq_head;
        if (l_state.gq_tail != (get_t *)0x0) {
          pgVar12 = l_state.gq_tail;
        }
        pgVar12->next = __ptr_01;
        pgVar14 = __ptr_01->next;
        l_state.gq_tail = __ptr_01;
      }
      __ptr_01 = pgVar14;
      if (l_state.gq_tail != (get_t *)0x0) {
        (l_state.gq_tail)->next = (get_link *)0x0;
      }
    }
    bVar16 = l_state.gq_tail == (get_t *)0x0;
    MPI_Iprobe(0xffffffff,0x6be8,l_state.world_comm,&local_78,local_60);
    if (local_78 == 0) goto LAB_0010873a;
    MPI_Get_count(local_60,&ompi_mpi_char,&local_74);
    __ptr_00 = (uint *)_my_malloc((long)local_74);
    MPI_Recv(__ptr_00,local_74,&ompi_mpi_char,local_60[0],0x6be8,l_state.world_comm,local_48);
    iVar7 = local_60[0];
    if (0x13 < *__ptr_00) {
      printf("[%d] header operation not recognized: %d\n",(ulong)(uint)l_state.rank);
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                    ,0x1a0,"void comex_make_progress(void)");
    }
    __src = __ptr_00 + 10;
    lVar13 = 4;
    switch(*__ptr_00) {
    case 0:
      memcpy(*(void **)(__ptr_00 + 2),__src,(long)(int)__ptr_00[6]);
      break;
    case 1:
      *__ptr_00 = 2;
      pcVar11 = (char *)_my_malloc((long)(int)__ptr_00[6] + 0x28);
      uVar4 = *(undefined8 *)(__ptr_00 + 2);
      uVar5 = *(undefined8 *)(__ptr_00 + 4);
      uVar6 = *(undefined8 *)(__ptr_00 + 6);
      *(undefined8 *)pcVar11 = *(undefined8 *)__ptr_00;
      *(undefined8 *)(pcVar11 + 8) = uVar4;
      *(undefined8 *)(pcVar11 + 0x10) = uVar5;
      *(undefined8 *)(pcVar11 + 0x18) = uVar6;
      *(undefined8 *)(pcVar11 + 0x20) = *(undefined8 *)(__ptr_00 + 8);
      uVar2 = __ptr_00[6];
      memcpy(pcVar11 + 0x28,*(void **)(__ptr_00 + 2),(long)(int)uVar2);
      count = uVar2 + 0x28;
      goto LAB_0010872d;
    default:
      memcpy(*(void **)(__ptr_00 + 4),__src,(long)(int)__ptr_00[6]);
    case 0x12:
      **(undefined1 **)(__ptr_00 + 8) = 0;
      break;
    case 3:
      iVar7 = 0x25;
      goto LAB_001086c3;
    case 4:
      lVar13 = 8;
      iVar7 = 0x26;
      goto LAB_001086c3;
    case 5:
      iVar7 = 0x27;
      goto LAB_001086c3;
    case 6:
      lVar13 = 8;
      iVar7 = 0x28;
      goto LAB_001086c3;
    case 7:
      lVar13 = 0x10;
      iVar7 = 0x29;
      goto LAB_001086c3;
    case 8:
      lVar13 = 8;
      iVar7 = 0x2a;
LAB_001086c3:
      _acc(iVar7,__ptr_00[6],*(void **)(__ptr_00 + 2),(void *)(lVar13 + (long)__src),__src);
      break;
    case 9:
      pcVar11 = (char *)_my_malloc(0x28);
      uVar4 = *(undefined8 *)(__ptr_00 + 2);
      uVar5 = *(undefined8 *)(__ptr_00 + 4);
      uVar6 = *(undefined8 *)(__ptr_00 + 6);
      *(undefined8 *)pcVar11 = *(undefined8 *)__ptr_00;
      *(undefined8 *)(pcVar11 + 8) = uVar4;
      *(undefined8 *)(pcVar11 + 0x10) = uVar5;
      *(undefined8 *)(pcVar11 + 0x18) = uVar6;
      *(undefined8 *)(pcVar11 + 0x20) = *(undefined8 *)(__ptr_00 + 8);
      pcVar11[0] = '\n';
      pcVar11[1] = '\0';
      pcVar11[2] = '\0';
      pcVar11[3] = '\0';
      count = 0x28;
      goto LAB_0010872d;
    case 10:
      **(int **)(__ptr_00 + 8) = **(int **)(__ptr_00 + 8) + -1;
      break;
    case 0xb:
      pbVar8 = (barrier_t *)_my_malloc(0x18);
      pbVar8->next = (barrier_link *)0x0;
      pbVar8->world_rank = iVar7;
      pbVar8->notify_address = *(void **)(__ptr_00 + 8);
      if (l_state.bq_head == (barrier_t *)0x0) {
        l_state.bq_tail = (barrier_t *)&l_state.bq_head;
      }
      (l_state.bq_tail)->next = pbVar8;
      l_state.bq_tail = pbVar8;
      break;
    case 0xc:
      **(char **)(__ptr_00 + 8) = **(char **)(__ptr_00 + 8) + '\x01';
      break;
    case 0xd:
      local_68 = (void *)CONCAT44(local_68._4_4_,local_60[0]);
      *__ptr_00 = 0xe;
      pcVar11 = (char *)_my_malloc((long)(int)__ptr_00[6] + 0x28);
      uVar4 = *(undefined8 *)(__ptr_00 + 2);
      uVar5 = *(undefined8 *)(__ptr_00 + 4);
      uVar6 = *(undefined8 *)(__ptr_00 + 6);
      *(undefined8 *)pcVar11 = *(undefined8 *)__ptr_00;
      *(undefined8 *)(pcVar11 + 8) = uVar4;
      *(undefined8 *)(pcVar11 + 0x10) = uVar5;
      *(undefined8 *)(pcVar11 + 0x18) = uVar6;
      *(undefined8 *)(pcVar11 + 0x20) = *(undefined8 *)(__ptr_00 + 8);
      local_70 = *(long **)(__ptr_00 + 2);
      uVar2 = __ptr_00[6];
      memcpy(pcVar11 + 0x28,local_70,(long)(int)uVar2);
      if ((long)(int)uVar2 == 8) {
        *local_70 = *local_70 + *(long *)__src;
      }
      else {
        if (uVar2 != 4) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                        ,0x704,"void _fetch_and_add_request_handler(header_t *, char *, int)");
        }
        *(uint *)local_70 = (int)*local_70 + *__src;
      }
      uVar2 = __ptr_00[6];
      iVar7 = (int)local_68;
      goto LAB_0010872a;
    case 0xf:
      if ((long)(int)__ptr_00[6] < 1) {
        __assert_fail("header->length > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                      ,0x72b,"void _swap_request_handler(header_t *, char *, int)");
      }
      local_70 = (long *)CONCAT44(local_70._4_4_,local_60[0]);
      pvVar9 = _my_malloc((long)(int)__ptr_00[6]);
      __n = (size_t)(int)__ptr_00[6];
      memcpy(pvVar9,__src,__n);
      local_68 = *(void **)(__ptr_00 + 2);
      memcpy(__src,local_68,__n);
      memcpy(local_68,pvVar9,__n);
      free(pvVar9);
      *__ptr_00 = 0x10;
      pcVar11 = (char *)_my_malloc((long)(int)__ptr_00[6] + 0x28);
      uVar4 = *(undefined8 *)(__ptr_00 + 2);
      uVar5 = *(undefined8 *)(__ptr_00 + 4);
      uVar6 = *(undefined8 *)(__ptr_00 + 6);
      *(undefined8 *)pcVar11 = *(undefined8 *)__ptr_00;
      *(undefined8 *)(pcVar11 + 8) = uVar4;
      *(undefined8 *)(pcVar11 + 0x10) = uVar5;
      *(undefined8 *)(pcVar11 + 0x18) = uVar6;
      *(undefined8 *)(pcVar11 + 0x20) = *(undefined8 *)(__ptr_00 + 8);
      uVar2 = __ptr_00[6];
      memcpy(pcVar11 + 0x28,__src,(long)(int)uVar2);
      iVar7 = (int)local_70;
LAB_0010872a:
      count = uVar2 + 0x28;
LAB_0010872d:
      _mq_push(iVar7,pcVar11,count);
      break;
    case 0x11:
      uVar2 = __ptr_00[6];
      pvVar9 = *(void **)(__ptr_00 + 8);
      pcVar10 = (comex_lock_t *)_my_malloc(0x18);
      pcVar10->next = (lock_link *)0x0;
      pcVar10->rank = iVar7;
      pcVar10->id = uVar2;
      pcVar10->notify_address = pvVar9;
      if (l_state.lq_tail == (comex_lock_t *)0x0) {
        if (l_state.lq_head != (comex_lock_t *)0x0) {
          __assert_fail("NULL == l_state.lq_head",
                        "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                        ,0x790,"void _lq_push(int, int, char *)");
        }
        l_state.lq_tail = (comex_lock_t *)&l_state.lq_head;
      }
      else if ((l_state.lq_tail)->next != (lock_link *)0x0) {
        __assert_fail("NULL == l_state.lq_tail->next",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                      ,0x788,"void _lq_push(int, int, char *)");
      }
      (l_state.lq_tail)->next = pcVar10;
      l_state.lq_tail = pcVar10;
      break;
    case 0x13:
      lVar13 = (long)(int)__ptr_00[6];
      if (lVar13 < 0) {
        __assert_fail("header->length >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                      ,0x76e,"void _unlock_request_handler(header_t *, int)");
      }
      if (l_state.num_mutexes <= (int)__ptr_00[6]) {
        __assert_fail("header->length < l_state.num_mutexes",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                      ,0x76f,"void _unlock_request_handler(header_t *, int)");
      }
      if (l_state.mutexes[lVar13] != local_60[0]) {
        __assert_fail("l_state.mutexes[header->length] == proc",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                      ,0x771,"void _unlock_request_handler(header_t *, int)");
      }
      l_state.mutexes[lVar13] = -1;
    }
    free(__ptr_00);
LAB_0010873a:
    if (l_state.lq_head == (comex_lock_t *)0x0) {
      pcVar10 = (comex_lock_t *)0x0;
      pcVar15 = (comex_lock_t *)0x0;
    }
    else {
      pcVar15 = (comex_lock_t *)0x0;
      pcVar10 = (comex_lock_t *)0x0;
      __ptr_02 = l_state.lq_head;
      do {
        if (l_state.mutexes[__ptr_02->id] < 0) {
          l_state.mutexes[__ptr_02->id] = __ptr_02->rank;
          pcVar11 = (char *)_my_malloc(0x28);
          pcVar11[0] = '\x12';
          pcVar11[1] = '\0';
          pcVar11[2] = '\0';
          pcVar11[3] = '\0';
          pcVar11[8] = '\0';
          pcVar11[9] = '\0';
          pcVar11[10] = '\0';
          pcVar11[0xb] = '\0';
          pcVar11[0xc] = '\0';
          pcVar11[0xd] = '\0';
          pcVar11[0xe] = '\0';
          pcVar11[0xf] = '\0';
          pcVar11[0x10] = '\0';
          pcVar11[0x11] = '\0';
          pcVar11[0x12] = '\0';
          pcVar11[0x13] = '\0';
          pcVar11[0x14] = '\0';
          pcVar11[0x15] = '\0';
          pcVar11[0x16] = '\0';
          pcVar11[0x17] = '\0';
          pcVar11[0x18] = -1;
          pcVar11[0x19] = -1;
          pcVar11[0x1a] = -1;
          pcVar11[0x1b] = -1;
          *(void **)(pcVar11 + 0x20) = __ptr_02->notify_address;
          _mq_push(__ptr_02->rank,pcVar11,0x28);
          plVar3 = __ptr_02->next;
          free(__ptr_02);
        }
        else {
          if (pcVar15 == (comex_lock_t *)0x0) {
            bVar17 = pcVar10 != (comex_lock_t *)0x0;
            pcVar10 = __ptr_02;
            if (bVar17) {
              __assert_fail("NULL == new_lock_head",
                            "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                            ,0x7cb,"int _lq_progress(void)");
            }
          }
          else {
            if (pcVar10 == (comex_lock_t *)0x0) {
              __assert_fail("new_lock_head",
                            "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                            ,0x7c5,"int _lq_progress(void)");
            }
            if (pcVar15->next != (lock_link *)0x0) {
              __assert_fail("NULL == new_lock_tail->next",
                            "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                            ,0x7c6,"int _lq_progress(void)");
            }
            pcVar15->next = __ptr_02;
          }
          plVar3 = __ptr_02->next;
          __ptr_02->next = (lock_link *)0x0;
          pcVar15 = __ptr_02;
        }
        __ptr_02 = plVar3;
      } while (__ptr_02 != (lock_link *)0x0);
    }
    l_state.lq_head = pcVar10;
    l_state.lq_tail = pcVar15;
    if ((bVar16 && local_78 == 0) && l_state.mq_size == 0) {
      return;
    }
  } while( true );
}

Assistant:

void comex_make_progress(void)
{
    int iprobe_flag=0;
    MPI_Status iprobe_status;
    int get_flag=0;
    int lock_flag=0;

#if DEBUG
    printf("[%d] comex_make_progress()\n", l_state.rank);
#endif

    do {
        iprobe_flag = 0;
        get_flag = 0;

        /* test for outgoing message completion only if we have outgoing
         * messages; we test from the head only */
        if (l_state.mq_head) {
            while (l_state.mq_head && _mq_test()) {
                _mq_pop();
            }
        }

        /* test for incoming get responses */
        if (_gq_test()) {
            get_flag = 1;
        }

        /* test for incoming messages */
        MPI_Iprobe(MPI_ANY_SOURCE, COMEX_TAG, l_state.world_comm,
                &iprobe_flag, &iprobe_status);
        if (iprobe_flag) {
            int length;
            char *message;
            char *payload;
            header_t *header;
            MPI_Status recv_status;

            /* allocate message buffer and get message */
            MPI_Get_count(&iprobe_status, MPI_CHAR, &length);
#if DEBUG
            printf("[%d] iprobe source=%d length=%d\n",
                    l_state.rank, iprobe_status.MPI_SOURCE, length);
#endif

            message = _my_malloc(length);
            MPI_Recv(message, length, MPI_CHAR,
                    iprobe_status.MPI_SOURCE, COMEX_TAG,
                    l_state.world_comm, &recv_status);
            header = (header_t*)message;
            payload = message + sizeof(header_t);
            /* dispatch message handler */
            switch (header->operation) {
                case OP_PUT:
                    _put_handler(header, payload);
                    break;
                case OP_GET_REQUEST:
                    _get_request_handler(header, iprobe_status.MPI_SOURCE);
                    break;
                case OP_GET_RESPONSE:
                    _get_response_handler(header, payload);
                    break;
                case OP_ACC_INT:
                case OP_ACC_DBL:
                case OP_ACC_FLT:
                case OP_ACC_CPL:
                case OP_ACC_DCP:
                case OP_ACC_LNG:
                    _acc_handler(header, payload);
                    break;
                case OP_FENCE_REQUEST:
                    _fence_request_handler(header, iprobe_status.MPI_SOURCE);
                    break;
                case OP_FENCE_RESPONSE:
                    _fence_response_handler(header, iprobe_status.MPI_SOURCE);
                    break;
                case OP_BARRIER_REQUEST:
                    _barrier_request_handler(header, iprobe_status.MPI_SOURCE);
                    break;
                case OP_BARRIER_RESPONSE:
                    _barrier_response_handler(header, iprobe_status.MPI_SOURCE);
                    break;
                case OP_FETCH_AND_ADD_REQUEST:
                    _fetch_and_add_request_handler(header, payload,
                            iprobe_status.MPI_SOURCE);
                    break;
                case OP_FETCH_AND_ADD_RESPONSE:
                    _fetch_and_add_response_handler(header, payload);
                    break;
                case OP_SWAP_REQUEST:
                    _swap_request_handler(header, payload,
                            iprobe_status.MPI_SOURCE);
                    break;
                case OP_SWAP_RESPONSE:
                    _swap_response_handler(header, payload);
                    break;
                case OP_LOCK_REQUEST:
                    _lock_request_handler(header, iprobe_status.MPI_SOURCE);
                    break;
                case OP_LOCK_RESPONSE:
                    _lock_response_handler(header);
                    break;
                case OP_UNLOCK:
                    _unlock_request_handler(header, iprobe_status.MPI_SOURCE);
                    break;
                default:
                    printf("[%d] header operation not recognized: %d\n",
                            l_state.rank, header->operation);
                    assert(0);
            }

            /* free the message buffer */
            _my_free(message);
        }

        lock_flag = _lq_progress();

        /* loop until we run out of incoming and outgoing messages */
#if DEBUG
        printf("[%d] iprobe_flag=%d || get_flag=%d || l_state.mq_size=%d lock_flag=%d\n",
                l_state.rank, iprobe_flag, get_flag, l_state.mq_size, lock_flag);
#endif
    } while (iprobe_flag || get_flag || l_state.mq_size);
}